

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char *pcVar2;
  float *pfVar3;
  undefined8 *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float sumfp32;
  float scale_in;
  int i;
  char *m;
  char *w_1;
  int q;
  int sum;
  float *outptr;
  int p;
  Option opt_g;
  Mat bottom_blob_tm;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Option *in_stack_00000788;
  float in_stack_00000794;
  Mat *in_stack_00000798;
  Mat *in_stack_000007a0;
  Mat *in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float fVar4;
  undefined8 in_stack_fffffffffffffe88;
  int _w;
  Mat *in_stack_fffffffffffffe90;
  float local_140;
  float local_13c;
  float local_138;
  int local_134;
  Mat local_130;
  char *local_f0;
  char *local_e8;
  int local_e0;
  int local_dc;
  float *local_d8;
  int local_cc;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  Mat local_88;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  Mat *local_20;
  int local_4;
  
  _w = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  local_44 = local_2c * local_30;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_88,in_RSI);
  if (local_40 != 1) {
    local_98 = local_28[4];
    local_b8 = *local_28;
    local_a8 = *(undefined4 *)(local_28 + 2);
    uStack_a4 = *(undefined4 *)((long)local_28 + 0x14);
    uStack_a0 = *(undefined4 *)(local_28 + 3);
    uStack_9c = *(undefined4 *)((long)local_28 + 0x1c);
    uStack_b0 = local_28[2];
    quantize_float32_to_int8
              (in_stack_000007a0,in_stack_00000798,in_stack_00000794,in_stack_00000788);
  }
  Mat::create(in_stack_fffffffffffffe90,_w,
              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
              (Allocator *)in_stack_fffffffffffffe78);
  bVar1 = Mat::empty(in_stack_fffffffffffffe70);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    for (local_cc = 0; local_cc < *(int *)(in_RDI + 0xb8); local_cc = local_cc + 1) {
      local_d8 = Mat::operator_cast_to_float_(local_20);
      local_dc = 0;
      for (local_e0 = 0; local_e0 < local_34; local_e0 = local_e0 + 1) {
        local_e8 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x110));
        local_e8 = local_e8 + (long)(local_44 * local_e0) + (long)(local_44 * local_34 * local_cc);
        Mat::channel(in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        pcVar2 = Mat::operator_cast_to_signed_char_(&local_130);
        Mat::~Mat((Mat *)0x14faad);
        for (local_134 = 0; local_134 < local_44; local_134 = local_134 + 1) {
          local_dc = (int)pcVar2[local_134] * (int)local_e8[local_134] + local_dc;
        }
        local_f0 = pcVar2;
      }
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 400),(long)local_cc);
      if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
        fVar4 = *(float *)(in_RDI + 0x1d0);
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 400),(long)local_cc);
        local_138 = 1.0 / (fVar4 * *pfVar3);
      }
      else {
        local_138 = 0.0;
      }
      local_13c = (float)local_dc * local_138;
      if (*(int *)(in_RDI + 0xbc) != 0) {
        in_stack_fffffffffffffe78 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x150),(long)local_cc);
        local_13c = *(float *)&in_stack_fffffffffffffe78->data + local_13c;
      }
      if (*(int *)(in_RDI + 200) == 1) {
        local_140 = 0.0;
        in_stack_fffffffffffffe70 = (Mat *)std::max<float>(&local_13c,&local_140);
        local_13c = *(float *)&in_stack_fffffffffffffe70->data;
      }
      local_d8[local_cc] = local_13c;
    }
    local_4 = 0;
  }
  local_c8 = 1;
  Mat::~Mat((Mat *)0x14fcbe);
  return local_4;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_tm = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_tm, bottom_blob_int8_scale, opt_g);
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        // channels
        for (int q=0; q<channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
            const signed char* m = bottom_blob_tm.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        if (activation_type == 1)
        {
            sumfp32 = std::max(sumfp32, 0.f);
        }

        outptr[p] = sumfp32;
    }

    return 0;
}